

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void cimg_library::CImg<unsigned_char>::_load_inr_header(FILE *file,int *out,float *voxel_size)

{
  int iVar1;
  char *pcVar2;
  CImgIOException *pCVar3;
  bool bVar4;
  char acStack_c8 [8];
  char tmp2 [64];
  char tmp1 [64];
  undefined1 local_40 [8];
  CImg<char> item;
  float *voxel_size_local;
  int *out_local;
  FILE *file_local;
  
  item._data = (char *)voxel_size;
  CImg<char>::CImg((CImg<char> *)local_40,0x400,1,1,1);
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
  *pcVar2 = '\0';
  tmp2[0x38] = '\0';
  tmp2[0x39] = '\0';
  tmp2[0x3a] = '\0';
  tmp2[0x3b] = '\0';
  tmp2[0x3c] = '\0';
  tmp2[0x3d] = '\0';
  tmp2[0x3e] = '\0';
  tmp2[0x3f] = '\0';
  tmp2[0x28] = '\0';
  tmp2[0x29] = '\0';
  tmp2[0x2a] = '\0';
  tmp2[0x2b] = '\0';
  tmp2[0x2c] = '\0';
  tmp2[0x2d] = '\0';
  tmp2[0x2e] = '\0';
  tmp2[0x2f] = '\0';
  tmp2[0x30] = '\0';
  tmp2[0x31] = '\0';
  tmp2[0x32] = '\0';
  tmp2[0x33] = '\0';
  tmp2[0x34] = '\0';
  tmp2[0x35] = '\0';
  tmp2[0x36] = '\0';
  tmp2[0x37] = '\0';
  tmp2[0x18] = '\0';
  tmp2[0x19] = '\0';
  tmp2[0x1a] = '\0';
  tmp2[0x1b] = '\0';
  tmp2[0x1c] = '\0';
  tmp2[0x1d] = '\0';
  tmp2[0x1e] = '\0';
  tmp2[0x1f] = '\0';
  tmp2[0x20] = '\0';
  tmp2[0x21] = '\0';
  tmp2[0x22] = '\0';
  tmp2[0x23] = '\0';
  tmp2[0x24] = '\0';
  tmp2[0x25] = '\0';
  tmp2[0x26] = '\0';
  tmp2[0x27] = '\0';
  tmp2[8] = '\0';
  tmp2[9] = '\0';
  tmp2[10] = '\0';
  tmp2[0xb] = '\0';
  tmp2[0xc] = '\0';
  tmp2[0xd] = '\0';
  tmp2[0xe] = '\0';
  tmp2[0xf] = '\0';
  tmp2[0x10] = '\0';
  tmp2[0x11] = '\0';
  tmp2[0x12] = '\0';
  tmp2[0x13] = '\0';
  tmp2[0x14] = '\0';
  tmp2[0x15] = '\0';
  tmp2[0x16] = '\0';
  tmp2[0x17] = '\0';
  acStack_c8[0] = '\0';
  acStack_c8[1] = '\0';
  acStack_c8[2] = '\0';
  acStack_c8[3] = '\0';
  acStack_c8[4] = '\0';
  acStack_c8[5] = '\0';
  acStack_c8[6] = '\0';
  acStack_c8[7] = '\0';
  tmp2[0] = '\0';
  tmp2[1] = '\0';
  tmp2[2] = '\0';
  tmp2[3] = '\0';
  tmp2[4] = '\0';
  tmp2[5] = '\0';
  tmp2[6] = '\0';
  tmp2[7] = '\0';
  iVar1 = __isoc99_fscanf(file,"%63s",item._16_8_);
  *out = iVar1;
  out[5] = 1;
  out[3] = 1;
  out[2] = 1;
  out[1] = 1;
  *out = 1;
  out[7] = -1;
  out[6] = -1;
  out[4] = -1;
  pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
  iVar1 = cimg::strncasecmp(pcVar2,"#INRIMAGE-4#{",0xd);
  if (iVar1 != 0) {
    pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar2 = pixel_type();
    CImgIOException::CImgIOException
              (pCVar3,"CImg<%s>::load_inr(): INRIMAGE-4 header not found.",pcVar2);
    __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  do {
    do {
      iVar1 = __isoc99_fscanf(file," %63[^\n]%*c",item._16_8_);
      bVar4 = false;
      if (iVar1 != -1) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
        iVar1 = strncmp(pcVar2,"##}",3);
        bVar4 = iVar1 != 0;
      }
      if (!bVar4) {
        if ((((*out < 0) || (out[1] < 0)) || (out[2] < 0)) || (out[3] < 0)) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,
                     "CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                     pcVar2,(ulong)(uint)*out,(ulong)(uint)out[1],(ulong)(uint)out[2],out[3]);
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if ((out[4] < 0) || (out[5] < 0)) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,"CImg<%s>::load_inr(): Incomplete pixel type defined in header.",pcVar2)
          ;
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if (out[6] < 0) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,"CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                     pcVar2);
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        if (out[7] < 0) {
          pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
          pcVar2 = pixel_type();
          CImgIOException::CImgIOException
                    (pCVar3,
                     "CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                     pcVar2);
          __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
        }
        CImg<char>::~CImg((CImg<char> *)local_40);
        return;
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      __isoc99_sscanf(pcVar2," XDIM%*[^0-9]%d",out);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      __isoc99_sscanf(pcVar2," YDIM%*[^0-9]%d",out + 1);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      __isoc99_sscanf(pcVar2," ZDIM%*[^0-9]%d",out + 2);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      __isoc99_sscanf(pcVar2," VDIM%*[^0-9]%d",out + 3);
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      __isoc99_sscanf(pcVar2," PIXSIZE%*[^0-9]%d",out + 6);
      if (item._data != (char *)0x0) {
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
        __isoc99_sscanf(pcVar2," VX%*[^0-9.+-]%f",item._data);
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
        __isoc99_sscanf(pcVar2," VY%*[^0-9.+-]%f",item._data + 4);
        pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
        __isoc99_sscanf(pcVar2," VZ%*[^0-9.+-]%f",item._data + 8);
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      iVar1 = __isoc99_sscanf(pcVar2," CPU%*[ =]%s",tmp2 + 0x38);
      if (iVar1 != 0) {
        iVar1 = cimg::strncasecmp(tmp2 + 0x38,"sun",3);
        out[7] = (uint)(iVar1 == 0);
      }
      pcVar2 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_40);
      iVar1 = __isoc99_sscanf(pcVar2," TYPE%*[ =]%s %s",tmp2 + 0x38,acStack_c8);
    } while (iVar1 == 0);
    if (iVar1 != 1) {
      if (iVar1 != 2) break;
      iVar1 = cimg::strncasecmp(tmp2 + 0x38,"unsigned",8);
      out[5] = (uint)(iVar1 != 0);
      strncpy(tmp2 + 0x38,acStack_c8,0x3f);
    }
    iVar1 = cimg::strncasecmp(tmp2 + 0x38,"int",3);
    if ((iVar1 == 0) || (iVar1 = cimg::strncasecmp(tmp2 + 0x38,"fixed",5), iVar1 == 0)) {
      out[4] = 0;
    }
    iVar1 = cimg::strncasecmp(tmp2 + 0x38,"float",5);
    if ((iVar1 == 0) || (iVar1 = cimg::strncasecmp(tmp2 + 0x38,"double",6), iVar1 == 0)) {
      out[4] = 1;
    }
    iVar1 = cimg::strncasecmp(tmp2 + 0x38,"packed",6);
    if (iVar1 == 0) {
      out[4] = 2;
    }
  } while (-1 < out[4]);
  pCVar3 = (CImgIOException *)__cxa_allocate_exception(0x10);
  pcVar2 = pixel_type();
  CImgIOException::CImgIOException
            (pCVar3,"CImg<%s>::load_inr(): Invalid pixel type \'%s\' defined in header.",pcVar2,
             acStack_c8);
  __cxa_throw(pCVar3,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

static void _load_inr_header(std::FILE *file, int out[8], float *const voxel_size) {
      CImg<charT> item(1024); *item = 0;
      char tmp1[64] = { 0 }, tmp2[64] = { 0 };
      out[0] = std::fscanf(file,"%63s",item._data);
      out[0] = out[1] = out[2] = out[3] = out[5] = 1; out[4] = out[6] = out[7] = -1;
      if(cimg::strncasecmp(item,"#INRIMAGE-4#{",13)!=0)
        throw CImgIOException("CImg<%s>::load_inr(): INRIMAGE-4 header not found.",
                              pixel_type());

      while (std::fscanf(file," %63[^\n]%*c",item._data)!=EOF && std::strncmp(item,"##}",3)) {
        cimg_sscanf(item," XDIM%*[^0-9]%d",out);
        cimg_sscanf(item," YDIM%*[^0-9]%d",out + 1);
        cimg_sscanf(item," ZDIM%*[^0-9]%d",out + 2);
        cimg_sscanf(item," VDIM%*[^0-9]%d",out + 3);
        cimg_sscanf(item," PIXSIZE%*[^0-9]%d",out + 6);
        if (voxel_size) {
          cimg_sscanf(item," VX%*[^0-9.+-]%f",voxel_size);
          cimg_sscanf(item," VY%*[^0-9.+-]%f",voxel_size + 1);
          cimg_sscanf(item," VZ%*[^0-9.+-]%f",voxel_size + 2);
        }
        if (cimg_sscanf(item," CPU%*[ =]%s",tmp1)) out[7]=cimg::strncasecmp(tmp1,"sun",3)?0:1;
        switch (cimg_sscanf(item," TYPE%*[ =]%s %s",tmp1,tmp2)) {
        case 0 : break;
        case 2 : out[5] = cimg::strncasecmp(tmp1,"unsigned",8)?1:0; std::strncpy(tmp1,tmp2,sizeof(tmp1) - 1);
        case 1 :
          if (!cimg::strncasecmp(tmp1,"int",3)   || !cimg::strncasecmp(tmp1,"fixed",5))  out[4] = 0;
          if (!cimg::strncasecmp(tmp1,"float",5) || !cimg::strncasecmp(tmp1,"double",6)) out[4] = 1;
          if (!cimg::strncasecmp(tmp1,"packed",6))                                       out[4] = 2;
          if (out[4]>=0) break;
        default :
          throw CImgIOException("CImg<%s>::load_inr(): Invalid pixel type '%s' defined in header.",
                                pixel_type(),
                                tmp2);
        }
      }
      if(out[0]<0 || out[1]<0 || out[2]<0 || out[3]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                              pixel_type(),
                              out[0],out[1],out[2],out[3]);
      if(out[4]<0 || out[5]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                              pixel_type());
      if(out[6]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                              pixel_type());
      if(out[7]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                              pixel_type());
    }